

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O1

UBool __thiscall icu_63::SimpleTimeZone::hasSameRules(SimpleTimeZone *this,TimeZone *other)

{
  char *__s1;
  char *__s2;
  int iVar1;
  
  if (this == (SimpleTimeZone *)other) {
    return '\x01';
  }
  __s1 = *(char **)((this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[-1] + 8);
  __s2 = *(char **)((other->super_UObject)._vptr_UObject[-1] + 8);
  if (((__s1 == __s2) || ((*__s1 != '*' && (iVar1 = strcmp(__s1,__s2), iVar1 == 0)))) &&
     ((this->rawOffset == *(int *)((long)&other[1].fID.fUnion + 0xc) &&
      (this->useDaylight == *(char *)((long)&other[1].fID.fUnion + 0x10))))) {
    if (this->useDaylight == '\0') {
      return '\x01';
    }
    if (((((this->dstSavings == *(int *)((long)&other[1].fID.fUnion + 0x1c)) &&
          (this->startMode == *(EMode *)((long)&other[1].fID.fUnion + 0x14))) &&
         (this->startMonth == *(char *)&other[1].super_UObject._vptr_UObject)) &&
        (((this->startDay == *(char *)((long)&other[1].super_UObject._vptr_UObject + 1) &&
          (this->startDayOfWeek == *(char *)((long)&other[1].super_UObject._vptr_UObject + 2))) &&
         ((this->startTime == *(int *)((long)&other[1].super_UObject._vptr_UObject + 4) &&
          ((this->startTimeMode ==
            *(TimeMode *)&other[1].fID.super_Replaceable.super_UObject._vptr_UObject &&
           (this->endMode == *(EMode *)((long)&other[1].fID.fUnion + 0x18))))))))) &&
       ((this->endMonth == *(char *)&other[1].fID.fUnion &&
        ((((this->endDay == *(char *)((long)&other[1].fID.fUnion + 1) &&
           (this->endDayOfWeek == *(char *)((long)&other[1].fID.fUnion + 2))) &&
          (this->endTime == other[1].fID.fUnion.fFields.fLength)) &&
         (this->endTimeMode ==
          *(TimeMode *)((long)&other[1].fID.super_Replaceable.super_UObject._vptr_UObject + 4)))))))
    {
      return this->startYear == other[1].fID.fUnion.fFields.fCapacity;
    }
  }
  return '\0';
}

Assistant:

UBool 
SimpleTimeZone::hasSameRules(const TimeZone& other) const
{
    if (this == &other) return TRUE;
    if (typeid(*this) != typeid(other)) return FALSE;
    SimpleTimeZone *that = (SimpleTimeZone*)&other;
    return rawOffset     == that->rawOffset &&
        useDaylight     == that->useDaylight &&
        (!useDaylight
         // Only check rules if using DST
         || (dstSavings     == that->dstSavings &&
             startMode      == that->startMode &&
             startMonth     == that->startMonth &&
             startDay       == that->startDay &&
             startDayOfWeek == that->startDayOfWeek &&
             startTime      == that->startTime &&
             startTimeMode  == that->startTimeMode &&
             endMode        == that->endMode &&
             endMonth       == that->endMonth &&
             endDay         == that->endDay &&
             endDayOfWeek   == that->endDayOfWeek &&
             endTime        == that->endTime &&
             endTimeMode    == that->endTimeMode &&
             startYear      == that->startYear));
}